

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

Bytes * __thiscall
SSM::ECUPort::readBytes(Bytes *__return_storage_ptr__,ECUPort *this,int num_bytes)

{
  int __fd;
  size_type sVar1;
  reference __buf;
  ssize_t sVar2;
  DeviceException *this_00;
  int *piVar3;
  char *__s;
  ReadTimeout *this_01;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  int local_44;
  iterator iStack_40;
  int n;
  iterator offset;
  int num_read;
  int bufsize;
  allocator<std::byte> local_1e;
  undefined1 local_1d;
  int local_1c;
  ECUPort *pEStack_18;
  int num_bytes_local;
  ECUPort *this_local;
  Bytes *response;
  
  local_1d = 0;
  local_1c = num_bytes;
  pEStack_18 = this;
  this_local = (ECUPort *)__return_storage_ptr__;
  std::allocator<std::byte>::allocator(&local_1e);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (__return_storage_ptr__,(long)num_bytes,&local_1e);
  std::allocator<std::byte>::~allocator(&local_1e);
  sVar1 = std::vector<std::byte,_std::allocator<std::byte>_>::size(__return_storage_ptr__);
  offset._M_current._4_4_ = 0;
  iStack_40 = std::vector<std::byte,_std::allocator<std::byte>_>::begin(__return_storage_ptr__);
  while( true ) {
    if (local_1c <= offset._M_current._4_4_) {
      return __return_storage_ptr__;
    }
    __fd = this->m_file;
    __buf = __gnu_cxx::
            __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
            operator*(&stack0xffffffffffffffc0);
    sVar2 = read(__fd,__buf,(long)(int)sVar1);
    local_44 = (int)sVar2;
    if (local_44 < 0) break;
    if (local_44 == 0) {
      this_01 = (ReadTimeout *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Port read timed out",&local_91);
      ReadTimeout::ReadTimeout(this_01,&local_90);
      __cxa_throw(this_01,&ReadTimeout::typeinfo,ReadTimeout::~ReadTimeout);
    }
    __gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
    operator+=(&stack0xffffffffffffffc0,(long)local_44);
    offset._M_current._4_4_ = local_44 + offset._M_current._4_4_;
  }
  local_6a = 1;
  this_00 = (DeviceException *)__cxa_allocate_exception(0x28);
  piVar3 = __errno_location();
  __s = strerror(*piVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
  DeviceException::DeviceException(this_00,&local_68);
  local_6a = 0;
  __cxa_throw(this_00,&DeviceException::typeinfo,DeviceException::~DeviceException);
}

Assistant:

Bytes ECUPort::readBytes(int num_bytes) const
  {
    Bytes response(num_bytes);
    int bufsize  = sizeof(Bytes::value_type)*response.size();
    int num_read = 0;
    
    Bytes::iterator offset = response.begin();
    while(num_read < num_bytes)
      {
	const int n = read(m_file, &(*offset), bufsize);

	if (n<0) throw(DeviceException(strerror(errno)));
	if (n==0) throw(ReadTimeout("Port read timed out"));

	offset   += n;
	num_read += n;
      }
    return response;
  }